

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O2

Vec_Wec_t * Gia_ManCheckUnateVec(Gia_Man_t *p,Vec_Int_t *vCiIds,Vec_Int_t *vCoIds)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Vec_Wec_t *p_03;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *p_04;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  int *piVar13;
  int *piVar14;
  int i;
  
  if (vCiIds == (Vec_Int_t *)0x0) {
    p_00 = Vec_IntStartNatural(p->vCis->nSize);
  }
  else {
    p_00 = Vec_IntDup(vCiIds);
  }
  if (vCoIds == (Vec_Int_t *)0x0) {
    p_01 = Vec_IntStartNatural(p->vCos->nSize);
  }
  else {
    p_01 = Vec_IntDup(vCoIds);
  }
  p_02 = Vec_WecStart(p_01->nSize);
  p_03 = Vec_WecStart(p->nObjs);
  for (iVar12 = 0; iVar12 < p_00->nSize; iVar12 = iVar12 + 1) {
    iVar4 = Vec_IntEntry(p_00,iVar12);
    pGVar7 = Gia_ManCi(p,iVar4);
    iVar5 = Gia_ObjId(p,pGVar7);
    pVVar8 = Vec_WecEntry(p_03,iVar5);
    if (iVar4 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntPush(pVVar8,iVar4 * 2);
  }
  iVar12 = 0;
  do {
    if ((p->nObjs <= iVar12) || (pGVar7 = Gia_ManObj(p,iVar12), pGVar7 == (Gia_Obj_t *)0x0)) {
      for (iVar12 = 0; iVar12 < p_01->nSize; iVar12 = iVar12 + 1) {
        iVar4 = Vec_IntEntry(p_01,iVar12);
        pGVar7 = Gia_ManCo(p,iVar4);
        iVar4 = Gia_ObjId(p,pGVar7);
        pVVar8 = Vec_WecEntry(p_03,iVar4 - (*(uint *)pGVar7 & 0x1fffffff));
        if ((pGVar7->field_0x3 & 0x20) != 0) {
          Vec_IntFlopBit(pVVar8);
        }
        pVVar9 = Vec_WecEntry(p_02,iVar12);
        for (iVar4 = 0; iVar4 < pVVar8->nSize; iVar4 = iVar4 + 1) {
          iVar5 = Vec_IntEntry(pVVar8,iVar4);
          Vec_IntPush(pVVar9,iVar5);
        }
        if ((pGVar7->field_0x3 & 0x20) != 0) {
          Vec_IntFlopBit(pVVar8);
        }
      }
      Vec_WecFree(p_03);
      Vec_IntFree(p_00);
      Vec_IntFree(p_01);
      return p_02;
    }
    uVar6 = (uint)*(undefined8 *)pGVar7;
    if ((~uVar6 & 0x1fffffff) != 0 && -1 < (int)uVar6) {
      pVVar8 = Vec_WecEntry(p_03,iVar12 - (uVar6 & 0x1fffffff));
      pVVar9 = Vec_WecEntry(p_03,iVar12 - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff));
      uVar10 = *(ulong *)pGVar7;
      if (((uint)uVar10 >> 0x1d & 1) != 0) {
        Vec_IntFlopBit(pVVar8);
        uVar10 = *(ulong *)pGVar7;
      }
      if ((uVar10 & 0x2000000000000000) != 0) {
        Vec_IntFlopBit(pVVar9);
      }
      p_04 = Vec_WecEntry(p_03,iVar12);
      Vec_IntGrow(p_04,pVVar9->nSize + pVVar8->nSize);
      piVar3 = p_04->pArray;
      piVar13 = pVVar8->pArray;
      piVar11 = pVVar9->pArray;
      piVar1 = piVar13 + pVVar8->nSize;
      piVar2 = piVar11 + pVVar9->nSize;
      uVar10 = 0;
      piVar14 = piVar3;
      while ((piVar13 < piVar1 && (piVar11 < piVar2))) {
        iVar4 = *piVar13;
        iVar5 = *piVar11;
        if (iVar4 == iVar5) {
          piVar13 = piVar13 + 1;
          *piVar14 = iVar4;
          piVar11 = piVar11 + 1;
        }
        else if (iVar4 < iVar5) {
          piVar13 = piVar13 + 1;
          *piVar14 = iVar4;
        }
        else {
          piVar11 = piVar11 + 1;
          *piVar14 = iVar5;
        }
        piVar14 = piVar14 + 1;
        uVar10 = uVar10 + 4;
      }
      for (; piVar13 < piVar1; piVar13 = piVar13 + 1) {
        *piVar14 = *piVar13;
        piVar14 = piVar14 + 1;
        uVar10 = uVar10 + 4;
      }
      for (; piVar11 < piVar2; piVar11 = piVar11 + 1) {
        *(int *)((long)piVar3 + uVar10) = *piVar11;
        uVar10 = uVar10 + 4;
      }
      iVar4 = (int)(uVar10 >> 2);
      p_04->nSize = iVar4;
      if (p_04->nCap < iVar4) {
        __assert_fail("vArr->nSize <= vArr->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar4 < pVVar8->nSize) {
        __assert_fail("vArr->nSize >= vArr1->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar4 < pVVar9->nSize) {
        __assert_fail("vArr->nSize >= vArr2->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      uVar10 = *(ulong *)pGVar7;
      if (((uint)uVar10 >> 0x1d & 1) != 0) {
        Vec_IntFlopBit(pVVar8);
        uVar10 = *(ulong *)pGVar7;
      }
      if ((uVar10 & 0x2000000000000000) != 0) {
        Vec_IntFlopBit(pVVar9);
      }
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManCheckUnateVec( Gia_Man_t * p, Vec_Int_t * vCiIds, Vec_Int_t * vCoIds )
{
    Vec_Int_t * vCiVec = vCiIds ? Vec_IntDup(vCiIds) : Vec_IntStartNatural(Gia_ManCiNum(p));
    Vec_Int_t * vCoVec = vCoIds ? Vec_IntDup(vCoIds) : Vec_IntStartNatural(Gia_ManCoNum(p));
    Vec_Wec_t * vUnatesCo = Vec_WecStart( Vec_IntSize(vCoVec) );
    Vec_Wec_t * vUnates   = Vec_WecStart( Gia_ManObjNum(p) );
    Vec_Int_t * vUnate0, * vUnate1;
    Gia_Obj_t * pObj; int i, CioId;
    Vec_IntForEachEntry( vCiVec, CioId, i )
    {
        pObj = Gia_ManCi( p, CioId );
        Vec_IntPush( Vec_WecEntry(vUnates, Gia_ObjId(p, pObj)), Abc_Var2Lit(CioId, 0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0(pObj, i));
        vUnate1 = Vec_WecEntry(vUnates, Gia_ObjFaninId1(pObj, i));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
        Vec_IntTwoMerge2( vUnate0, vUnate1, Vec_WecEntry(vUnates, i) ); 
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        vUnate1 = Gia_ObjFaninC1(pObj) ? Vec_IntFlopBit(vUnate1) : vUnate1;
    }
    Vec_IntForEachEntry( vCoVec, CioId, i )
    {
        pObj    = Gia_ManCo( p, CioId );
        vUnate0 = Vec_WecEntry(vUnates, Gia_ObjFaninId0p(p, pObj));
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
        Vec_IntAppend( Vec_WecEntry(vUnatesCo, i), vUnate0 );
        vUnate0 = Gia_ObjFaninC0(pObj) ? Vec_IntFlopBit(vUnate0) : vUnate0;
    }
    Vec_WecFree( vUnates );
    Vec_IntFree( vCiVec );
    Vec_IntFree( vCoVec );
    return vUnatesCo;
}